

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,StateVar *var)

{
  ostream *poVar1;
  void *this;
  size_type sVar2;
  const_reference pvVar3;
  uint local_1c;
  uint i;
  StateVar *var_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Name: ");
  poVar1 = std::operator<<(poVar1,(string *)&(var->super_NamedVar).name_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"PrevName:");
  poVar1 = std::operator<<(poVar1,(string *)&var->prev_name_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"CurrName:");
  poVar1 = std::operator<<(poVar1,(string *)&var->curr_name_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"FullyObs:");
  this = (void *)std::ostream::operator<<(poVar1,(bool)(var->observed_ & 1));
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::operator<<(os,"Values:");
  local_1c = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(var->super_NamedVar).super_Variable.values_);
    if (sVar2 <= local_1c) break;
    poVar1 = std::operator<<(os," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
    poVar1 = std::operator<<(poVar1,"=");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(var->super_NamedVar).super_Variable.values_,(ulong)local_1c);
    std::operator<<(poVar1,(string *)pvVar3);
    local_1c = local_1c + 1;
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const StateVar& var) {
	os << "Name: " << var.name_ << endl;
	os << "PrevName:" << var.prev_name_ << endl;
	os << "CurrName:" << var.curr_name_ << endl;
	os << "FullyObs:" << var.observed_ << endl;
	os << "Values:";

	for (unsigned int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	return os;
}